

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall
capnp::JsonCodec::AnnotatedHandler::AnnotatedHandler
          (AnnotatedHandler *this,JsonCodec *codec,StructSchema schema,
          Maybe<capnp::json::DiscriminatorOptions::Reader> *discriminator,
          Maybe<kj::StringPtr> *unionDeclName,Vector<capnp::Schema> *dependencies)

{
  Maybe<kj::StringPtr> *pMVar1;
  bool bVar2;
  FieldInfo *pFVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  ElementCount EVar6;
  Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo> *pAVar7;
  char *pcVar8;
  PointerType PVar9;
  uint uVar10;
  ElementCount index;
  anon_union_48_1_a8c68091_for_NullableValue<capnp::json::DiscriminatorOptions::Reader>_2 *paVar11;
  ArrayPtr<const_char> AVar12;
  StringPtr key;
  Reader schemaProto;
  Reader anno;
  Reader typeName;
  Mapper<capnp::StructSchema::FieldList> local_1e8;
  Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo> *local_1a8;
  PointerReader local_1a0;
  Reader local_180;
  Maybe<kj::StringPtr> *local_150;
  JsonCodec *local_148;
  Vector<capnp::Schema> *local_140;
  FieldList local_138;
  Schema local_100;
  StructReader local_f8;
  ArrayPtr<const_char> local_c0;
  undefined1 local_b0 [48];
  FieldNameInfo local_80;
  FieldNameInfo local_58;
  
  (this->super_Handler<capnp::DynamicStruct,_(capnp::Style)2>).super_HandlerBase._vptr_HandlerBase =
       (_func_int **)&PTR_encodeBase_006f6510;
  (this->schema).super_Schema.raw = (RawBrandedSchema *)schema.super_Schema.raw;
  local_1a8 = &this->fields;
  (this->fields).ptr = (FieldInfo *)0x0;
  (this->fields).size_ = 0;
  (this->fields).disposer = (ArrayDisposer *)0x0;
  (this->fieldsByName).table.rows.builder.ptr = (Entry *)0x0;
  (this->fieldsByName).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>
        *)0x0;
  (this->fieldsByName).table.rows.builder.endPtr = (Entry *)0x0;
  (this->fieldsByName).table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (this->fieldsByName).table.indexes.erasedCount = 0;
  (this->fieldsByName).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (this->fieldsByName).table.indexes.buckets.size_ = 0;
  (this->fieldsByName).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (this->unionTagValues).table.rows.builder.ptr = (Entry *)0x0;
  (this->unionTagValues).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> *)0x0;
  (this->unionTagValues).table.rows.builder.endPtr = (Entry *)0x0;
  (this->unionTagValues).table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (this->unionTagValues).table.indexes.erasedCount = 0;
  (this->unionTagValues).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (this->unionTagValues).table.indexes.buckets.size_ = 0;
  (this->unionTagValues).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (this->unionTagName).ptr.isSet = false;
  local_150 = unionDeclName;
  local_100 = schema.super_Schema.raw;
  Schema::getProto(&local_180,&local_100);
  local_1e8.array.list.reader.segment = (SegmentReader *)local_180._reader.capTable;
  local_1e8.array.list.reader.capTable = (CapTableReader *)local_180._reader.pointers;
  local_1e8.array.parent.super_Schema.raw = (Schema)(Schema)local_180._reader.segment;
  local_1e8.array.list.reader.ptr._0_4_ = local_180._reader.nestingLimit;
  if (local_180._reader.pointerCount == 0) {
    local_1e8.array.list.reader.segment = (SegmentReader *)0x0;
    local_1e8.array.list.reader.capTable = (CapTableReader *)(WirePointer *)0x0;
    local_1e8.array.parent.super_Schema.raw = (Schema)(Schema)(RawBrandedSchema *)0x0;
    local_1e8.array.list.reader.ptr._0_4_ = 0x7fffffff;
  }
  local_c0 = (ArrayPtr<const_char>)
             capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)&local_1e8,(void *)0x0,0);
  local_148 = codec;
  local_140 = dependencies;
  if ((discriminator->ptr).isSet == false) {
    if (local_180._reader.pointerCount < 3) {
      local_180._reader.nestingLimit = 0x7fffffff;
      local_180._reader.capTable = (CapTableReader *)0x0;
      local_138.list.reader.capTable = (CapTableReader *)0x0;
      local_180._reader.segment = (SegmentReader *)0x0;
    }
    else {
      local_138.list.reader.capTable = (CapTableReader *)(local_180._reader.pointers + 2);
    }
    local_138.parent.super_Schema.raw = (Schema)(Schema)local_180._reader.segment;
    local_138.list.reader.segment = (SegmentReader *)local_180._reader.capTable;
    local_138.list.reader.ptr._0_4_ = local_180._reader.nestingLimit;
    capnp::_::PointerReader::getList
              ((ListReader *)&local_1e8,(PointerReader *)&local_138,INLINE_COMPOSITE,(word *)0x0);
    EVar6 = (ElementCount)local_1e8.array.list.reader.ptr;
    if ((ElementCount)local_1e8.array.list.reader.ptr != 0) {
      index = 0;
      do {
        capnp::_::ListReader::getStructElement
                  ((StructReader *)&local_138,(ListReader *)&local_1e8,index);
        if ((0x3f < local_138.list.reader.elementCount) &&
           (*(WirePointer *)local_138.list.reader.capTable == (WirePointer)0xcfa794e8d19a0162)) {
          if ((short)local_138.list.reader.step == 0) {
            local_1a0.nestingLimit = 0x7fffffff;
            local_1a0.capTable = (CapTableReader *)0x0;
            local_1a0.pointer = (WirePointer *)0x0;
            local_1a0.segment = (SegmentReader *)0x0;
          }
          else {
            local_1a0.pointer =
                 (WirePointer *)
                 CONCAT44(local_138.list.reader.ptr._4_4_,(ElementCount)local_138.list.reader.ptr);
            local_1a0.capTable = (CapTableReader *)local_138.list.reader.segment;
            local_1a0.segment = (SegmentReader *)local_138.parent.super_Schema.raw;
            local_1a0.nestingLimit = local_138.list.reader.structDataSize;
          }
          capnp::_::PointerReader::getStruct(&local_f8,&local_1a0,(word *)0x0);
          local_1a0.capTable = local_f8.capTable;
          local_1a0.pointer = local_f8.pointers;
          local_1a0.segment = local_f8.segment;
          local_1a0.nestingLimit = local_f8.nestingLimit;
          if (local_f8.pointerCount == 0) {
            local_1a0.capTable = (CapTableReader *)0x0;
            local_1a0.pointer = (WirePointer *)0x0;
            local_1a0.segment = (SegmentReader *)(FieldInfo *)0x0;
            local_1a0.nestingLimit = 0x7fffffff;
          }
          capnp::_::PointerReader::getStruct((StructReader *)local_b0,&local_1a0,(word *)0x0);
          if ((discriminator->ptr).isSet == true) {
            (discriminator->ptr).isSet = false;
          }
          *(undefined4 *)((long)&(discriminator->ptr).field_1 + 0x20) = local_b0._32_4_;
          *(undefined2 *)((long)&(discriminator->ptr).field_1 + 0x24) = local_b0._36_2_;
          *(undefined2 *)((long)&(discriminator->ptr).field_1 + 0x26) = local_b0._38_2_;
          *(undefined8 *)&(discriminator->ptr).field_1.value._reader.nestingLimit = local_b0._40_8_;
          (discriminator->ptr).field_1.value._reader.data = (void *)local_b0._16_8_;
          (discriminator->ptr).field_1.value._reader.pointers = (WirePointer *)local_b0._24_8_;
          (discriminator->ptr).field_1.value._reader.segment = (SegmentReader *)local_b0._0_8_;
          (discriminator->ptr).field_1.value._reader.capTable = (CapTableReader *)local_b0._8_8_;
          (discriminator->ptr).isSet = true;
        }
        index = index + 1;
      } while (EVar6 != index);
    }
  }
  bVar2 = (discriminator->ptr).isSet;
  uVar10 = 0;
  paVar11 = &(discriminator->ptr).field_1;
  if (bVar2 == false) {
    paVar11 = (anon_union_48_1_a8c68091_for_NullableValue<capnp::json::DiscriminatorOptions::Reader>_2
               *)0x0;
  }
  if (bVar2 != true) goto LAB_002f97ab;
  if (*(short *)((long)paVar11 + 0x24) == 0) {
    local_1e8.array.parent.super_Schema.raw = (Schema)(RawBrandedSchema *)0x0;
    local_1e8.array.list.reader.segment = (SegmentReader *)0x0;
    local_1e8.array.list.reader.capTable = (CapTableReader *)0x0;
    local_1e8.array.list.reader.ptr._0_4_ = 0x7fffffff;
  }
  else {
    local_1e8.array.parent.super_Schema.raw = (Schema)(paVar11->value)._reader.segment;
    local_1e8.array.list.reader.segment = (SegmentReader *)(paVar11->value)._reader.capTable;
    local_1e8.array.list.reader.capTable = (CapTableReader *)(paVar11->value)._reader.pointers;
    local_1e8.array.list.reader.ptr._0_4_ = *(ListElementCount *)((long)paVar11 + 0x28);
  }
  PVar9 = capnp::_::PointerReader::getPointerType((PointerReader *)&local_1e8);
  pMVar1 = &this->unionTagName;
  if (PVar9 == NULL_) {
    if (pMVar1 != local_150) {
      if ((pMVar1->ptr).isSet == true) {
        (pMVar1->ptr).isSet = false;
      }
      if ((local_150->ptr).isSet == true) {
        sVar4 = (local_150->ptr).field_1.value.content.size_;
        (this->unionTagName).ptr.field_1.value.content.ptr =
             (local_150->ptr).field_1.value.content.ptr;
        (this->unionTagName).ptr.field_1.value.content.size_ = sVar4;
        goto LAB_002f9635;
      }
    }
  }
  else {
    if (*(short *)((long)paVar11 + 0x24) == 0) {
      local_1e8.array.list.reader.ptr._0_4_ = 0x7fffffff;
      local_1e8.array.list.reader.segment = (SegmentReader *)0x0;
      local_1e8.array.list.reader.capTable = (CapTableReader *)0x0;
      local_1e8.array.parent.super_Schema.raw = (Schema)(RawBrandedSchema *)0x0;
    }
    else {
      local_1e8.array.parent.super_Schema.raw = (Schema)(paVar11->value)._reader.segment;
      local_1e8.array.list.reader.segment = (SegmentReader *)(paVar11->value)._reader.capTable;
      local_1e8.array.list.reader.capTable = (CapTableReader *)(paVar11->value)._reader.pointers;
      local_1e8.array.list.reader.ptr._0_4_ = *(ListElementCount *)((long)paVar11 + 0x28);
    }
    AVar12 = (ArrayPtr<const_char>)
             capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)&local_1e8,(void *)0x0,0);
    if ((pMVar1->ptr).isSet == true) {
      (pMVar1->ptr).isSet = false;
    }
    (this->unionTagName).ptr.field_1.value.content = AVar12;
LAB_002f9635:
    (pMVar1->ptr).isSet = true;
  }
  if ((pMVar1->ptr).isSet == true) {
    local_58.type = UNION_TAG;
    local_58.index = 0;
    local_58.prefixLength = 0;
    local_58.ownName.content.ptr = (char *)0x0;
    local_58.ownName.content.size_ = 0;
    local_58.ownName.content.disposer = (ArrayDisposer *)0x0;
    kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::insert
              (&this->fieldsByName,(StringPtr)(this->unionTagName).ptr.field_1.value.content,
               &local_58);
    sVar4 = local_58.ownName.content.size_;
    pcVar8 = local_58.ownName.content.ptr;
    if (local_58.ownName.content.ptr != (char *)0x0) {
      local_58.ownName.content.ptr = (char *)0x0;
      local_58.ownName.content.size_ = 0;
      (**(local_58.ownName.content.disposer)->_vptr_ArrayDisposer)
                (local_58.ownName.content.disposer,pcVar8,1,sVar4,sVar4,0);
    }
  }
  if (*(ushort *)((long)paVar11 + 0x24) < 2) {
    local_1e8.array.parent.super_Schema.raw = (Schema)(RawBrandedSchema *)0x0;
    local_1e8.array.list.reader.segment = (SegmentReader *)0x0;
    local_1e8.array.list.reader.capTable = (CapTableReader *)0x0;
    local_1e8.array.list.reader.ptr._0_4_ = 0x7fffffff;
  }
  else {
    local_1e8.array.parent.super_Schema.raw = (Schema)(paVar11->value)._reader.segment;
    local_1e8.array.list.reader.segment = (SegmentReader *)(paVar11->value)._reader.capTable;
    local_1e8.array.list.reader.capTable = (CapTableReader *)((paVar11->value)._reader.pointers + 1)
    ;
    local_1e8.array.list.reader.ptr._0_4_ = *(ElementCount *)((long)paVar11 + 0x28);
  }
  PVar9 = capnp::_::PointerReader::getPointerType((PointerReader *)&local_1e8);
  if (PVar9 != NULL_) {
    if (*(ushort *)((long)paVar11 + 0x24) < 2) {
      local_1e8.array.list.reader.ptr._0_4_ = 0x7fffffff;
      local_1e8.array.list.reader.segment = (SegmentReader *)0x0;
      local_1e8.array.list.reader.capTable = (CapTableReader *)0x0;
      local_1e8.array.parent.super_Schema.raw = (Schema)(RawBrandedSchema *)0x0;
    }
    else {
      local_1e8.array.parent.super_Schema.raw = (Schema)(paVar11->value)._reader.segment;
      local_1e8.array.list.reader.segment = (SegmentReader *)(paVar11->value)._reader.capTable;
      local_1e8.array.list.reader.capTable =
           (CapTableReader *)((paVar11->value)._reader.pointers + 1);
      local_1e8.array.list.reader.ptr._0_4_ = *(ElementCount *)((long)paVar11 + 0x28);
    }
    key.content = (ArrayPtr<const_char>)
                  capnp::_::PointerReader::getBlob<capnp::Text>
                            ((PointerReader *)&local_1e8,(void *)0x0,0);
    local_80.type = UNION_VALUE;
    local_80.index = 0;
    local_80.prefixLength = 0;
    local_80.ownName.content.ptr = (char *)0x0;
    local_80.ownName.content.size_ = 0;
    local_80.ownName.content.disposer = (ArrayDisposer *)0x0;
    kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::insert
              (&this->fieldsByName,key,&local_80);
    sVar4 = local_80.ownName.content.size_;
    pcVar8 = local_80.ownName.content.ptr;
    if (local_80.ownName.content.ptr != (char *)0x0) {
      local_80.ownName.content.ptr = (char *)0x0;
      local_80.ownName.content.size_ = 0;
      (**(local_80.ownName.content.disposer)->_vptr_ArrayDisposer)
                (local_80.ownName.content.disposer,pcVar8,1,sVar4,sVar4,0);
    }
  }
LAB_002f97ab:
  pAVar7 = local_1a8;
  if (0x11f < local_180._reader.dataSize) {
    uVar10 = *(uint *)((long)local_180._reader.data + 0x20);
  }
  this->discriminantOffset = uVar10;
  StructSchema::getFields(&local_138,(StructSchema *)&local_100);
  local_1e8.array.list.reader.nestingLimit = local_138.list.reader.nestingLimit;
  local_1e8.array.list.reader._44_4_ = local_138.list.reader._44_4_;
  local_1e8.array.list.reader.ptr =
       (byte *)CONCAT44(local_138.list.reader.ptr._4_4_,(ElementCount)local_138.list.reader.ptr);
  local_1e8.array.list.reader.capTable = local_138.list.reader.capTable;
  local_1e8.array.parent.super_Schema.raw = local_138.parent.super_Schema.raw;
  local_1e8.array.list.reader.segment = local_138.list.reader.segment;
  local_b0._0_8_ = &local_c0;
  local_b0._8_8_ = local_148;
  local_b0._16_8_ = local_140;
  local_b0._24_8_ = this;
  local_b0._32_8_ = discriminator;
  kj::_::Mapper<capnp::StructSchema::FieldList>::
  operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_json_c__:990:14)>
            ((Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo> *)&local_f8,&local_1e8,
             (anon_class_40_5_590b9dd2 *)local_b0);
  pFVar3 = pAVar7->ptr;
  if (pFVar3 != (FieldInfo *)0x0) {
    sVar4 = (this->fields).size_;
    pAVar7->ptr = (FieldInfo *)0x0;
    pAVar7->size_ = 0;
    pAVar5 = (this->fields).disposer;
    (**pAVar5->_vptr_ArrayDisposer)(pAVar5,pFVar3,0x38,sVar4,sVar4,0);
  }
  (this->fields).ptr = (FieldInfo *)local_f8.segment;
  (this->fields).size_ = (size_t)local_f8.capTable;
  (this->fields).disposer = (ArrayDisposer *)local_f8.data;
  return;
}

Assistant:

AnnotatedHandler(JsonCodec& codec, StructSchema schema,
                   kj::Maybe<json::DiscriminatorOptions::Reader> discriminator,
                   kj::Maybe<kj::StringPtr> unionDeclName,
                   kj::Vector<Schema>& dependencies)
      : schema(schema) {
    auto schemaProto = schema.getProto();
    auto typeName = schemaProto.getDisplayName();

    if (discriminator == kj::none) {
      // There are two cases of unions:
      // * Named unions, which are special cases of named groups. In this case, the union may be
      //   annotated by annotating the field. In this case, we receive a non-null `discriminator`
      //   as a constructor parameter, and schemaProto.getAnnotations() must be empty because
      //   it's not possible to annotate a group's type (because the type is anonymous).
      // * Unnamed unions, of which there can only be one in any particular scope. In this case,
      //   the parent struct type itself is annotated.
      // So if we received `null` as the constructor parameter, check for annotations on the struct
      // type.
      for (auto anno: schemaProto.getAnnotations()) {
        switch (anno.getId()) {
          case JSON_DISCRIMINATOR_ANNOTATION_ID:
            discriminator = anno.getValue().getStruct().getAs<json::DiscriminatorOptions>();
            break;
        }
      }
    }

    KJ_IF_SOME(d, discriminator) {
      if (d.hasName()) {
        unionTagName = d.getName();
      } else {
        unionTagName = unionDeclName;
      }
      KJ_IF_SOME(u, unionTagName) {
        fieldsByName.insert(u, FieldNameInfo {
          FieldNameInfo::UNION_TAG, 0, 0, nullptr
        });
      }

      if (d.hasValueName()) {
        fieldsByName.insert(d.getValueName(), FieldNameInfo {
          FieldNameInfo::UNION_VALUE, 0, 0, nullptr
        });
      }
    }

    discriminantOffset = schemaProto.getStruct().getDiscriminantOffset();

    fields = KJ_MAP(field, schema.getFields()) {
      auto fieldProto = field.getProto();
      auto type = field.getType();
      auto fieldName = fieldProto.getName();

      FieldNameInfo nameInfo;
      nameInfo.index = field.getIndex();
      nameInfo.type = FieldNameInfo::NORMAL;
      nameInfo.prefixLength = 0;

      FieldInfo info;
      info.name = fieldName;

      kj::Maybe<json::DiscriminatorOptions::Reader> subDiscriminator;
      bool flattened = false;
      for (auto anno: field.getProto().getAnnotations()) {
        switch (anno.getId()) {
          case JSON_NAME_ANNOTATION_ID:
            info.name = anno.getValue().getText();
            break;
          case JSON_FLATTEN_ANNOTATION_ID:
            KJ_REQUIRE(type.isStruct(), "only struct types can be flattened", fieldName, typeName);
            flattened = true;
            info.prefix = anno.getValue().getStruct().getAs<json::FlattenOptions>().getPrefix();
            break;
          case JSON_DISCRIMINATOR_ANNOTATION_ID:
            KJ_REQUIRE(fieldProto.isGroup(), "only unions can have discriminator");
            subDiscriminator = anno.getValue().getStruct().getAs<json::DiscriminatorOptions>();
            break;
          case JSON_BASE64_ANNOTATION_ID: {
            KJ_REQUIRE(field.getType().isData(), "only Data can be marked for base64 encoding");
            static Base64Handler handler;
            codec.addFieldHandler(field, handler);
            break;
          }
          case JSON_HEX_ANNOTATION_ID: {
            KJ_REQUIRE(field.getType().isData(), "only Data can be marked for hex encoding");
            static HexHandler handler;
            codec.addFieldHandler(field, handler);
            break;
          }
        }
      }

      if (fieldProto.isGroup()) {
        // Load group type handler now, even if not flattened, so that we can pass its
        // `subDiscriminator`.
        kj::Maybe<kj::StringPtr> subFieldName;
        if (flattened) {
          // If the group was flattened, then we allow its field name to be used as the
          // discriminator name, so that the discriminator doesn't have to explicitly specify a
          // name.
          subFieldName = fieldName;
        }
        auto& subHandler = codec.loadAnnotatedHandler(
            type.asStruct(), subDiscriminator, subFieldName, dependencies);
        if (flattened) {
          info.flattenHandler = subHandler;
        }
      } else if (type.isStruct()) {
        if (flattened) {
          info.flattenHandler = codec.loadAnnotatedHandler(
              type.asStruct(), kj::none, kj::none, dependencies);
        }
      }

      bool isUnionMember = fieldProto.getDiscriminantValue() != schema::Field::NO_DISCRIMINANT;

      KJ_IF_SOME(fh, info.flattenHandler) {
        // Set up fieldsByName for each of the child's fields.
        for (auto& entry: fh.fieldsByName) {
          kj::StringPtr flattenedName;
          kj::String ownName;
          if (info.prefix.size() > 0) {
            ownName = kj::str(info.prefix, entry.key);
            flattenedName = ownName;
          } else {
            flattenedName = entry.key;
          }

          fieldsByName.upsert(flattenedName, FieldNameInfo {
            isUnionMember ? FieldNameInfo::FLATTENED_FROM_UNION : FieldNameInfo::FLATTENED,
            field.getIndex(), (uint)info.prefix.size(), kj::mv(ownName)
          }, [&](FieldNameInfo& existing, FieldNameInfo&& replacement) {
            KJ_REQUIRE(existing.type == FieldNameInfo::FLATTENED_FROM_UNION &&
                       replacement.type == FieldNameInfo::FLATTENED_FROM_UNION,
                "flattened members have the same name and are not mutually exclusive");
          });
        }
      }

      info.nameForDiscriminant = info.name;

      if (!flattened) {
        bool isUnionWithValueName = false;
        if (isUnionMember) {
          KJ_IF_SOME(d, discriminator) {
            if (d.hasValueName()) {
              info.name = d.getValueName();
              isUnionWithValueName = true;
            }
          }
        }

        if (!isUnionWithValueName) {
          fieldsByName.insert(info.name, kj::mv(nameInfo));
        }
      }

      if (isUnionMember) {
        unionTagValues.insert(info.nameForDiscriminant, field);
      }

      // Look for dependencies that we need to add.
      while (type.isList()) type = type.asList().getElementType();
      if (codec.impl->typeHandlers.find(type) == kj::none) {
        switch (type.which()) {
          case schema::Type::STRUCT:
            dependencies.add(type.asStruct());
            break;
          case schema::Type::ENUM:
            dependencies.add(type.asEnum());
            break;
          case schema::Type::INTERFACE:
            dependencies.add(type.asInterface());
            break;
          default:
            break;
        }
      }

      return info;
    };
  }